

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int get_class_atom(REParseState *s,CharRange *cr,uint8_t **pp,BOOL inclass)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  int in_ECX;
  ulong *in_RDX;
  uint8_t **in_RSI;
  REParseState *in_RDI;
  int ret;
  uint32_t c;
  uint8_t *p;
  BOOL in_stack_00000054;
  uint8_t **in_stack_00000058;
  CharRange *in_stack_00000060;
  REParseState *in_stack_00000068;
  uint32_t c_00;
  CharRange *cr_00;
  CharRange *p_00;
  undefined4 in_stack_ffffffffffffffd8;
  uint local_4;
  
  p_00 = (CharRange *)*in_RDX;
  uVar1 = (uint)(byte)p_00->len;
  if (uVar1 == 0) {
    if ((CharRange *)in_RDI->buf_end <= p_00) {
LAB_001cd060:
      iVar2 = re_parse_error(in_RDI,"unexpected end");
      return iVar2;
    }
LAB_001cd07d:
    if (uVar1 < 0x80) {
      local_4 = uVar1;
      p_00 = (CharRange *)((long)&p_00->len + 1);
    }
    else {
      local_4 = unicode_from_utf8((uint8_t *)p_00,6,(uint8_t **)&stack0xffffffffffffffd0);
      if ((0xffff < local_4) && (in_RDI->is_utf16 == 0)) {
        iVar2 = re_parse_error(in_RDI,"malformed unicode char");
        return iVar2;
      }
    }
    goto LAB_001cd0df;
  }
  if (uVar1 != 0x5c) goto LAB_001cd07d;
  pbVar3 = (byte *)((long)&p_00->len + 1);
  if (in_RDI->buf_end <= pbVar3) goto LAB_001cd060;
  cr_00 = (CharRange *)((long)&p_00->len + 2);
  uVar1 = (uint)*pbVar3;
  switch(uVar1) {
  case 0x44:
    c_00 = 1;
    break;
  default:
switchD_001cce63_caseD_45:
    p_00 = (CharRange *)((long)&p_00->len + 1);
    local_4 = lre_parse_escape(in_RSI,(int)((ulong)in_RDX >> 0x20));
    if ((int)local_4 < 0) {
      if ((((local_4 != 0xfffffffe) || ((char)p_00->len == '\0')) ||
          (pcVar4 = strchr("^$\\.*+?()[]{}|/",(uint)(byte)p_00->len), pcVar4 == (char *)0x0)) &&
         (in_RDI->is_utf16 != 0)) {
LAB_001cd029:
        iVar2 = re_parse_error(in_RDI,"invalid escape sequence in regular expression");
        return iVar2;
      }
      goto LAB_001cd07d;
    }
    goto LAB_001cd0df;
  case 0x50:
  case 0x70:
    if (in_RDI->is_utf16 == 0) goto switchD_001cce63_caseD_45;
    iVar2 = parse_unicode_property
                      (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
    if (iVar2 != 0) {
      return -1;
    }
    local_4 = 0x40000000;
    p_00 = cr_00;
    goto LAB_001cd0df;
  case 0x53:
    c_00 = 3;
    break;
  case 0x57:
    c_00 = 5;
    break;
  case 99:
    local_4 = (uint)(byte)cr_00->len;
    if ((((local_4 < 0x61) || (0x7a < local_4)) && ((local_4 < 0x41 || (0x5a < local_4)))) &&
       ((((local_4 < 0x30 || (0x39 < local_4)) && (local_4 != 0x5f)) ||
        ((in_ECX == 0 || (in_RDI->is_utf16 != 0)))))) {
      if (in_RDI->is_utf16 != 0) goto LAB_001cd029;
      p_00 = (CharRange *)((long)&p_00->len + 1);
      local_4 = 0x5c;
    }
    else {
      local_4 = local_4 & 0x1f;
      p_00 = (CharRange *)((long)&p_00->len + 3);
    }
    goto LAB_001cd0df;
  case 100:
    c_00 = 0;
    break;
  case 0x73:
    c_00 = 2;
    break;
  case 0x77:
    c_00 = 4;
  }
  iVar2 = cr_init_char_range((REParseState *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),cr_00,c_00);
  if (iVar2 == 0) {
    local_4 = 0x40000000;
    p_00 = cr_00;
LAB_001cd0df:
    *in_RDX = (ulong)p_00;
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

static int get_class_atom(REParseState *s, CharRange *cr,
                          const uint8_t **pp, BOOL inclass)
{
    const uint8_t *p;
    uint32_t c;
    int ret;
    
    p = *pp;

    c = *p;
    switch(c) {
    case '\\':
        p++;
        if (p >= s->buf_end)
            goto unexpected_end;
        c = *p++;
        switch(c) {
        case 'd':
            c = CHAR_RANGE_d;
            goto class_range;
        case 'D':
            c = CHAR_RANGE_D;
            goto class_range;
        case 's':
            c = CHAR_RANGE_s;
            goto class_range;
        case 'S':
            c = CHAR_RANGE_S;
            goto class_range;
        case 'w':
            c = CHAR_RANGE_w;
            goto class_range;
        case 'W':
            c = CHAR_RANGE_W;
        class_range:
            if (cr_init_char_range(s, cr, c))
                return -1;
            c = CLASS_RANGE_BASE;
            break;
        case 'c':
            c = *p;
            if ((c >= 'a' && c <= 'z') ||
                (c >= 'A' && c <= 'Z') ||
                (((c >= '0' && c <= '9') || c == '_') &&
                 inclass && !s->is_utf16)) {   /* Annex B.1.4 */
                c &= 0x1f;
                p++;
            } else if (s->is_utf16) {
                goto invalid_escape;
            } else {
                /* otherwise return '\' and 'c' */
                p--;
                c = '\\';
            }
            break;
#ifdef CONFIG_ALL_UNICODE
        case 'p':
        case 'P':
            if (s->is_utf16) {
                if (parse_unicode_property(s, cr, &p, (c == 'P')))
                    return -1;
                c = CLASS_RANGE_BASE;
                break;
            }
            /* fall thru */
#endif
        default:
            p--;
            ret = lre_parse_escape(&p, s->is_utf16 * 2);
            if (ret >= 0) {
                c = ret;
            } else {
                if (ret == -2 && *p != '\0' && strchr("^$\\.*+?()[]{}|/", *p)) {
                    /* always valid to escape these characters */
                    goto normal_char;
                } else if (s->is_utf16) {
                invalid_escape:
                    return re_parse_error(s, "invalid escape sequence in regular expression");
                } else {
                    /* just ignore the '\' */
                    goto normal_char;
                }
            }
            break;
        }
        break;
    case '\0':
        if (p >= s->buf_end) {
        unexpected_end:
            return re_parse_error(s, "unexpected end");
        }
        /* fall thru */
    default:
    normal_char:
        /* normal char */
        if (c >= 128) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
            if ((unsigned)c > 0xffff && !s->is_utf16) {
                /* XXX: should handle non BMP-1 code points */
                return re_parse_error(s, "malformed unicode char");
            }
        } else {
            p++;
        }
        break;
    }
    *pp = p;
    return c;
}